

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

bool DoCheckSpecies(AActor *mo,FName *filterSpecies,bool exclude)

{
  int iVar1;
  undefined8 in_RAX;
  bool bVar2;
  FName actorSpecies;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  AActor::GetSpecies((AActor *)&stack0xffffffffffffffec);
  iVar1 = filterSpecies->Index;
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else if (exclude) {
    bVar2 = local_14 != iVar1;
  }
  else {
    bVar2 = local_14 == iVar1;
  }
  return bVar2;
}

Assistant:

static bool DoCheckSpecies(AActor *mo, FName filterSpecies, bool exclude)
{
	FName actorSpecies = mo->GetSpecies();
	if (filterSpecies == NAME_None) return true;
	return exclude ? (actorSpecies != filterSpecies) : (actorSpecies == filterSpecies);
}